

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaFormatQName(xmlChar **buf,xmlChar *namespaceName,xmlChar *localName)

{
  xmlChar *pxVar1;
  xmlChar *localName_local;
  xmlChar *namespaceName_local;
  xmlChar **buf_local;
  
  if (*buf != (xmlChar *)0x0) {
    (*xmlFree)(*buf);
    *buf = (xmlChar *)0x0;
  }
  if (namespaceName != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup((xmlChar *)"{");
    *buf = pxVar1;
    pxVar1 = xmlStrcat(*buf,namespaceName);
    *buf = pxVar1;
    pxVar1 = xmlStrcat(*buf,"}");
    *buf = pxVar1;
  }
  if (localName == (xmlChar *)0x0) {
    pxVar1 = xmlStrcat(*buf,(xmlChar *)"(NULL)");
    *buf = pxVar1;
  }
  else {
    if (namespaceName == (xmlChar *)0x0) {
      return localName;
    }
    pxVar1 = xmlStrcat(*buf,localName);
    *buf = pxVar1;
  }
  return *buf;
}

Assistant:

static const xmlChar*
xmlSchemaFormatQName(xmlChar **buf,
		     const xmlChar *namespaceName,
		     const xmlChar *localName)
{
    FREE_AND_NULL(*buf)
    if (namespaceName != NULL) {
	*buf = xmlStrdup(BAD_CAST "{");
	*buf = xmlStrcat(*buf, namespaceName);
	*buf = xmlStrcat(*buf, BAD_CAST "}");
    }
    if (localName != NULL) {
	if (namespaceName == NULL)
	    return(localName);
	*buf = xmlStrcat(*buf, localName);
    } else {
	*buf = xmlStrcat(*buf, BAD_CAST "(NULL)");
    }
    return ((const xmlChar *) *buf);
}